

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QGraphicsItem * __thiscall QGraphicsItem::clipPath(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  _func_int **pp_Var2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  QGraphicsItem *in_RSI;
  QGraphicsItem *this_00;
  QGraphicsItem *pQVar6;
  QGraphicsItemPrivate *d;
  long in_FS_OFFSET;
  QGraphicsItem local_b0;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (in_RSI->d_ptr).d;
  if ((*(ulong *)&pQVar1->field_0x160 & 0x800020000) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QPainterPath::QPainterPath((QPainterPath *)this);
      return this;
    }
    goto LAB_005ec54a;
  }
  local_98 = 0xffffffff;
  uStack_94 = 0xffffffff;
  uStack_90 = 0xffffffff;
  uStack_8c = 0xffffffff;
  local_b0.d_ptr.d._0_4_ = 0xffffffff;
  local_b0.d_ptr.d._4_4_ = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  (*in_RSI->_vptr_QGraphicsItem[3])(&local_b0.d_ptr);
  if (((double)CONCAT44(uStack_94,local_98) <= 0.0) ||
     ((double)CONCAT44(uStack_8c,uStack_90) <= 0.0)) {
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else {
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    QPainterPath::addRect((QRectF *)this);
    if ((pQVar1->field_0x162 & 2) == 0) {
LAB_005ec4cb:
      if ((*(ulong *)&pQVar1->field_0x160 & 0x800000000) == 0) goto LAB_005ec522;
      (*in_RSI->_vptr_QGraphicsItem[4])(&local_b0);
      QPainterPath::intersected((QPainterPath *)&local_88);
      pp_Var2 = this->_vptr_QGraphicsItem;
      this->_vptr_QGraphicsItem = (_func_int **)local_88.m_matrix[0][0];
      local_88.m_matrix[0][0] = (qreal)pp_Var2;
      QPainterPath::~QPainterPath((QPainterPath *)&local_88);
      pQVar6 = &local_b0;
    }
    else {
      this_00 = in_RSI;
      pQVar6 = in_RSI;
      do {
        pQVar6 = ((pQVar6->d_ptr).d)->parent;
        if (pQVar6 == (QGraphicsItem *)0x0) break;
        if ((((pQVar6->d_ptr).d)->field_0x164 & 0x10) != 0) {
          bVar3 = false;
          itemTransform(&local_88,this_00,pQVar6,(bool *)0x0);
          QTransform::map((QPainterPath *)&local_b0);
          pp_Var2 = this->_vptr_QGraphicsItem;
          this->_vptr_QGraphicsItem = local_b0._vptr_QGraphicsItem;
          local_b0._vptr_QGraphicsItem = pp_Var2;
          QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
          (*pQVar6->_vptr_QGraphicsItem[4])(&local_b0,pQVar6);
          QPainterPath::intersected((QPainterPath *)&local_88);
          pp_Var2 = this->_vptr_QGraphicsItem;
          this->_vptr_QGraphicsItem = (_func_int **)local_88.m_matrix[0][0];
          local_88.m_matrix[0][0] = (qreal)pp_Var2;
          QPainterPath::~QPainterPath((QPainterPath *)&local_88);
          QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
          cVar5 = QPainterPath::isEmpty();
          this_00 = pQVar6;
          if (cVar5 != '\0') {
            bVar4 = true;
            goto LAB_005ec4bc;
          }
        }
      } while ((((pQVar6->d_ptr).d)->field_0x162 & 2) != 0);
      bVar3 = true;
      bVar4 = false;
      if (this_00 != in_RSI) {
        itemTransform(&local_88,this_00,in_RSI,(bool *)0x0);
        QTransform::map((QPainterPath *)&local_b0);
        pp_Var2 = this->_vptr_QGraphicsItem;
        this->_vptr_QGraphicsItem = local_b0._vptr_QGraphicsItem;
        local_b0._vptr_QGraphicsItem = pp_Var2;
        QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
        bVar4 = false;
      }
LAB_005ec4bc:
      if (bVar3) goto LAB_005ec4cb;
      pQVar6 = this;
      if (bVar4) goto LAB_005ec522;
    }
    QPainterPath::~QPainterPath((QPainterPath *)pQVar6);
  }
LAB_005ec522:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_005ec54a:
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsItem::clipPath() const
{
    Q_D(const QGraphicsItem);
    if (!isClipped())
        return QPainterPath();

    const QRectF thisBoundingRect(boundingRect());
    if (thisBoundingRect.isEmpty())
        return QPainterPath();

    QPainterPath clip;
    // Start with the item's bounding rect.
    clip.addRect(thisBoundingRect);

    if (d->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren) {
        const QGraphicsItem *parent = this;
        const QGraphicsItem *lastParent = this;

        // Intersect any in-between clips starting at the top and moving downwards.
        while ((parent = parent->d_ptr->parent)) {
            if (parent->d_ptr->flags & ItemClipsChildrenToShape) {
                // Map clip to the current parent and intersect with its shape/clipPath
                clip = lastParent->itemTransform(parent).map(clip);
                clip = clip.intersected(parent->shape());
                if (clip.isEmpty())
                    return clip;
                lastParent = parent;
            }

            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren))
                break;
        }

        if (lastParent != this) {
            // Map clip back to the item's transform.
            // ### what if itemtransform fails
            clip = lastParent->itemTransform(this).map(clip);
        }
    }

    if (d->flags & ItemClipsToShape)
        clip = clip.intersected(shape());

    return clip;
}